

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

ALLEGRO_FILE_INTERFACE * al_get_new_file_interface(void)

{
  long *plVar1;
  ALLEGRO_FILE_INTERFACE *pAVar2;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar1 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
  }
  if ((*plVar1 == 0) ||
     (pAVar2 = *(ALLEGRO_FILE_INTERFACE **)(*plVar1 + 0x110),
     pAVar2 == (ALLEGRO_FILE_INTERFACE *)0x0)) {
    pAVar2 = &_al_file_interface_stdio;
  }
  return pAVar2;
}

Assistant:

const ALLEGRO_FILE_INTERFACE *al_get_new_file_interface(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return &_al_file_interface_stdio;

   /* FIXME: this situation should never arise because tls_ has the stdio
    * interface set as a default, but it arises on OS X if
    * pthread_getspecific() is called before pthreads_thread_init()...
    */
   if (tls->new_file_interface)
      return tls->new_file_interface;
   else
      return &_al_file_interface_stdio;
}